

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O2

void __thiscall
CATCH2_INTERNAL_TEST_0::TestSessionConnection::TestSessionConnection(TestSessionConnection *this)

{
  DataDictionaryProvider *this_00;
  SessionID *pSVar1;
  SessionSettings *this_01;
  SessionID *this_02;
  TestSocketMonitor *this_03;
  TestApplication *app;
  MemoryStoreFactory *factory;
  TestSession *pTVar2;
  SocketAcceptor *pSVar3;
  SocketInitiator *pSVar4;
  TestSocketInitiator *pTVar5;
  SocketConnection *pSVar6;
  Dictionary DVar7;
  Dictionary DVar8;
  SocketMonitor *pSVar9;
  TimeRange *__p;
  TestSession *pTVar10;
  SocketAcceptor *this_04;
  SocketInitiator *this_05;
  TestSocketInitiator *this_06;
  SocketConnection *this_07;
  int in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7c [12];
  Dictionary *this_08;
  Dictionary *pDVar11;
  undefined1 in_stack_fffffffffffffc90 [64];
  undefined1 auVar12 [32];
  FieldBase local_308;
  unique_ptr<TestSession,_std::default_delete<TestSession>_> *local_2b0;
  unique_ptr<TestSession,_std::default_delete<TestSession>_> *local_2a8;
  SessionID *local_2a0;
  SessionID *local_298;
  unique_ptr<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_> *local_290;
  STRING local_288;
  unique_ptr<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_> *local_268;
  SocketMonitor *local_260;
  unique_ptr<FIX::SocketInitiator,_std::default_delete<FIX::SocketInitiator>_> *local_258;
  unique_ptr<FIX::SocketAcceptor,_std::default_delete<FIX::SocketAcceptor>_> *local_250;
  DataDictionaryProvider *local_248;
  FieldBase local_240;
  SocketServer *local_1e8;
  string local_1e0;
  STRING local_1c0;
  STRING local_1a0;
  SessionID local_180;
  
  FIX::DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)this);
  this_00 = &(this->super_BaseSocketConnection).acceptorProvider;
  FIX::DataDictionaryProvider::DataDictionaryProvider(this_00);
  pSVar1 = &(this->super_BaseSocketConnection).initiatorSessionID;
  local_248 = this_00;
  FIX::SessionID::SessionID(pSVar1);
  pDVar11 = &(this->super_BaseSocketConnection).dictionaryInitiator;
  FIX::Dictionary::Dictionary(pDVar11);
  this_01 = &(this->super_BaseSocketConnection).settingsInitiator;
  local_2a0 = pSVar1;
  FIX::SessionSettings::SessionSettings(this_01);
  this_02 = &(this->super_BaseSocketConnection).acceptorSessionID;
  FIX::SessionID::SessionID(this_02);
  this_08 = &(this->super_BaseSocketConnection).dictionaryAcceptor;
  FIX::Dictionary::Dictionary(this_08);
  local_298 = (SessionID *)&(this->super_BaseSocketConnection).settingsAcceptor;
  FIX::SessionSettings::SessionSettings((SessionSettings *)local_298);
  this_03 = &(this->super_BaseSocketConnection).monitor;
  FIX::SocketMonitor::SocketMonitor(&this_03->super_SocketMonitor,0);
  *(undefined ***)&(this->super_BaseSocketConnection).monitor = &PTR__SocketMonitor_002fe588;
  (this->super_BaseSocketConnection).monitor.signaledSocket = -1;
  (this->super_BaseSocketConnection).monitor.unsignalSocket = -1;
  (this->super_BaseSocketConnection).monitor.dropSocket = -1;
  (this->super_BaseSocketConnection).application.super_NullApplication.super_Application.
  _vptr_Application = (_func_int **)&PTR__Application_002fe5d8;
  (this->super_BaseSocketConnection).application.count = 0;
  *(code **)&(this->super_BaseSocketConnection).factory = FIX::SocketServer::accept;
  (this->super_BaseSocketConnection).logFactory.super_LogFactory._vptr_LogFactory =
       (_func_int **)&PTR__LogFactory_002fe648;
  local_1e8 = &(this->super_BaseSocketConnection).server;
  local_260 = &this_03->super_SocketMonitor;
  FIX::SocketServer::SocketServer(local_1e8,0);
  local_290 = &(this->super_BaseSocketConnection).sessionTime;
  local_2b0 = &(this->super_BaseSocketConnection).initiatorSession;
  local_2a8 = &(this->super_BaseSocketConnection).acceptorSession;
  local_258 = &(this->super_BaseSocketConnection).initiator;
  local_268 = &(this->super_BaseSocketConnection).testInitiator;
  local_250 = &(this->super_BaseSocketConnection).acceptor;
  (this->super_BaseSocketConnection).testInitiator._M_t.
  super___uniq_ptr_impl<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>._M_t.
  super__Tuple_impl<0UL,_TestSocketInitiator_*,_std::default_delete<TestSocketInitiator>_>.
  super__Head_base<0UL,_TestSocketInitiator_*,_false>._M_head_impl = (TestSocketInitiator *)0x0;
  (this->super_BaseSocketConnection).acceptor._M_t.
  super___uniq_ptr_impl<FIX::SocketAcceptor,_std::default_delete<FIX::SocketAcceptor>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketAcceptor_*,_std::default_delete<FIX::SocketAcceptor>_>.
  super__Head_base<0UL,_FIX::SocketAcceptor_*,_false>._M_head_impl = (SocketAcceptor *)0x0;
  (this->super_BaseSocketConnection).acceptorSession._M_t.
  super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
  super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
  super__Head_base<0UL,_TestSession_*,_false>._M_head_impl = (TestSession *)0x0;
  (this->super_BaseSocketConnection).initiator._M_t.
  super___uniq_ptr_impl<FIX::SocketInitiator,_std::default_delete<FIX::SocketInitiator>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketInitiator_*,_std::default_delete<FIX::SocketInitiator>_>.
  super__Head_base<0UL,_FIX::SocketInitiator_*,_false>._M_head_impl = (SocketInitiator *)0x0;
  (this->super_BaseSocketConnection).sessionTime._M_t.
  super___uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>._M_t.
  super__Tuple_impl<0UL,_FIX::TimeRange_*,_std::default_delete<FIX::TimeRange>_>.
  super__Head_base<0UL,_FIX::TimeRange_*,_false>._M_head_impl = (TimeRange *)0x0;
  (this->super_BaseSocketConnection).initiatorSession._M_t.
  super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
  super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
  super__Head_base<0UL,_TestSession_*,_false>._M_head_impl = (TestSession *)0x0;
  (this->super_BaseSocketConnection).socket = 0x65;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"FIX.4.2",(allocator<char> *)&stack0xfffffffffffffc87);
  FIX::BeginString::BeginString((BeginString *)&stack0xfffffffffffffc90,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"INITIATOR",(allocator<char> *)&stack0xfffffffffffffc86);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_308,&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"ACCEPT",(allocator<char> *)&stack0xfffffffffffffc85);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_240,&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"",(allocator<char> *)&stack0xfffffffffffffc84);
  FIX::SessionID::SessionID
            (&local_180,(string *)&stack0xfffffffffffffca0,&local_308.m_string,&local_240.m_string,
             &local_1e0);
  FIX::SessionID::operator=(pSVar1,&local_180);
  FIX::SessionID::~SessionID(&local_180);
  std::__cxx11::string::~string((string *)&local_1e0);
  FIX::FieldBase::~FieldBase(&local_240);
  std::__cxx11::string::~string((string *)&local_1c0);
  FIX::FieldBase::~FieldBase(&local_308);
  std::__cxx11::string::~string((string *)&local_1a0);
  FIX::FieldBase::~FieldBase((FieldBase *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"FIX.4.2",(allocator<char> *)&stack0xfffffffffffffc87);
  FIX::BeginString::BeginString((BeginString *)&stack0xfffffffffffffc90,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"ACCEPT",(allocator<char> *)&stack0xfffffffffffffc86);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_308,&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"INITIATOR",(allocator<char> *)&stack0xfffffffffffffc85);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_240,&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"",(allocator<char> *)&stack0xfffffffffffffc84);
  FIX::SessionID::SessionID
            (&local_180,(string *)&stack0xfffffffffffffca0,&local_308.m_string,&local_240.m_string,
             &local_1e0);
  FIX::SessionID::operator=(this_02,&local_180);
  FIX::SessionID::~SessionID(&local_180);
  std::__cxx11::string::~string((string *)&local_1e0);
  FIX::FieldBase::~FieldBase(&local_240);
  std::__cxx11::string::~string((string *)&local_1c0);
  FIX::FieldBase::~FieldBase(&local_308);
  std::__cxx11::string::~string((string *)&local_1a0);
  FIX::FieldBase::~FieldBase((FieldBase *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"FIX42",(allocator<char> *)&local_308);
  FIX::TestSettings::pathForSpec((string *)&local_180,(string *)&stack0xfffffffffffffc90);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)this,&pSVar1->m_beginString,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"FIX42",(allocator<char> *)&local_308);
  FIX::TestSettings::pathForSpec((string *)&local_180,(string *)&stack0xfffffffffffffc90);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (this_00,&this_02->m_beginString,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  __p = (TimeRange *)operator_new(0x40);
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_180);
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&stack0xfffffffffffffc90);
  FIX::TimeRange::TimeRange
            (__p,(UtcTimeOnly *)&local_180,(UtcTimeOnly *)&stack0xfffffffffffffc90,0,0x1f);
  std::__uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>::reset
            ((__uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_> *)local_290,__p)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"ConnectionType",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"initiator",(allocator<char> *)&local_240);
  FIX::Dictionary::setString((string *)pDVar11,(string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"FileStorePath",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"store",(allocator<char> *)&local_240);
  FIX::Dictionary::setString((string *)pDVar11,(string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"UseDataDictionary",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"N",(allocator<char> *)&local_240);
  FIX::Dictionary::setString((string *)pDVar11,(string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"StartTime",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"12:00:00",(allocator<char> *)&local_240);
  FIX::Dictionary::setString((string *)pDVar11,(string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"EndTime",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"12:00:00",(allocator<char> *)&local_240);
  FIX::Dictionary::setString((string *)pDVar11,(string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"StartDay",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"Sun",(allocator<char> *)&local_240);
  FIX::Dictionary::setString((string *)pDVar11,(string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"EndDay",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"Mon",(allocator<char> *)&local_240);
  FIX::Dictionary::setString((string *)pDVar11,(string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"HeartBtInt",(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"30",(allocator<char> *)&local_240);
  FIX::Dictionary::setString((string *)pDVar11,(string *)&local_180);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_180);
  FIX::Dictionary::Dictionary((Dictionary *)&local_180,pDVar11);
  DVar7._4_12_ = in_stack_fffffffffffffc7c;
  DVar7._vptr_Dictionary._0_4_ = in_stack_fffffffffffffc78;
  DVar7.m_data._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_08;
  auVar12 = in_stack_fffffffffffffc90._32_32_;
  DVar7.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffc90._0_8_;
  DVar7.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffc90._8_8_;
  DVar7.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffc90._16_8_;
  DVar7.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffc90._24_8_;
  DVar7.m_name._M_dataplus._M_p = (pointer)auVar12._0_8_;
  DVar7.m_name._M_string_length = auVar12._8_8_;
  DVar7.m_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar12._16_16_;
  FIX::SessionSettings::set((SessionID *)this_01,DVar7);
  FIX::Dictionary::~Dictionary((Dictionary *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"ConnectionType",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"acceptor",(allocator<char> *)&local_288);
  FIX::Dictionary::setString((string *)this_08,(string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"FileStorePath",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"store",(allocator<char> *)&local_288);
  FIX::Dictionary::setString((string *)this_08,(string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"UseDataDictionary",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"N",(allocator<char> *)&local_288);
  FIX::Dictionary::setString((string *)this_08,(string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"StartTime",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"12:00:00",(allocator<char> *)&local_288);
  FIX::Dictionary::setString((string *)this_08,(string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"EndTime",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"12:00:00",(allocator<char> *)&local_288);
  FIX::Dictionary::setString((string *)this_08,(string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"StartDay",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"Sun",(allocator<char> *)&local_288);
  FIX::Dictionary::setString((string *)this_08,(string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc90,"EndDay",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"Mon",(allocator<char> *)&local_288);
  pDVar11 = this_08;
  FIX::Dictionary::setString((string *)this_08,(string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  FIX::Dictionary::Dictionary((Dictionary *)&stack0xfffffffffffffc90,this_08);
  DVar8._4_12_ = in_stack_fffffffffffffc7c;
  DVar8._vptr_Dictionary._0_4_ = in_stack_fffffffffffffc78;
  DVar8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pDVar11;
  auVar12 = in_stack_fffffffffffffc90._32_32_;
  DVar8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffc90._0_8_;
  DVar8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffc90._8_8_;
  DVar8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffc90._16_8_;
  DVar8.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffc90._24_8_;
  DVar8.m_name._M_dataplus._M_p = (pointer)auVar12._0_8_;
  DVar8.m_name._M_string_length = auVar12._8_8_;
  DVar8.m_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar12._16_16_;
  FIX::SessionSettings::set(local_298,DVar8);
  FIX::Dictionary::~Dictionary((Dictionary *)&stack0xfffffffffffffc90);
  pTVar10 = (TestSession *)operator_new(0x888);
  app = &(this->super_BaseSocketConnection).application;
  factory = &(this->super_BaseSocketConnection).factory;
  CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX
  ::SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const__int_
            (pTVar10,(Application *)app,(MessageStoreFactory *)factory,this_02,local_248,
             (local_290->_M_t).
             super___uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>._M_t.
             super__Tuple_impl<0UL,_FIX::TimeRange_*,_std::default_delete<FIX::TimeRange>_>.
             super__Head_base<0UL,_FIX::TimeRange_*,_false>._M_head_impl,in_stack_fffffffffffffc78);
  pTVar2 = (local_2a8->_M_t).super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>.
           _M_t.super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
           super__Head_base<0UL,_TestSession_*,_false>._M_head_impl;
  (local_2a8->_M_t).super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
  super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
  super__Head_base<0UL,_TestSession_*,_false>._M_head_impl = pTVar10;
  if (pTVar2 != (TestSession *)0x0) {
    (**(code **)(*(long *)pTVar2 + 8))();
  }
  this_04 = (SocketAcceptor *)operator_new(0x1d8);
  pTVar2 = (local_2a8->_M_t).super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>.
           _M_t.super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
           super__Head_base<0UL,_TestSession_*,_false>._M_head_impl;
  FIX::SocketAcceptor::SocketAcceptor
            (this_04,(Application *)app,(MessageStoreFactory *)factory,(SessionSettings *)local_298,
             &(this->super_BaseSocketConnection).logFactory.super_LogFactory);
  *(undefined ***)this_04 = &PTR__SocketAcceptor_002fe6e8;
  *(undefined ***)(this_04 + 0x130) = &PTR__TestSocketAcceptor_002fe768;
  *(TestSession **)(this_04 + 0x1d0) = pTVar2;
  pSVar3 = (local_250->_M_t).
           super___uniq_ptr_impl<FIX::SocketAcceptor,_std::default_delete<FIX::SocketAcceptor>_>.
           _M_t.
           super__Tuple_impl<0UL,_FIX::SocketAcceptor_*,_std::default_delete<FIX::SocketAcceptor>_>.
           super__Head_base<0UL,_FIX::SocketAcceptor_*,_false>._M_head_impl;
  (local_250->_M_t).
  super___uniq_ptr_impl<FIX::SocketAcceptor,_std::default_delete<FIX::SocketAcceptor>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketAcceptor_*,_std::default_delete<FIX::SocketAcceptor>_>.
  super__Head_base<0UL,_FIX::SocketAcceptor_*,_false>._M_head_impl = this_04;
  if (pSVar3 != (SocketAcceptor *)0x0) {
    (**(code **)(*(long *)pSVar3 + 8))();
  }
  pSVar1 = local_2a0;
  this_05 = (SocketInitiator *)operator_new(0x488);
  FIX::SocketInitiator::SocketInitiator
            (this_05,(Application *)app,(MessageStoreFactory *)factory,this_01);
  pSVar4 = (local_258->_M_t).
           super___uniq_ptr_impl<FIX::SocketInitiator,_std::default_delete<FIX::SocketInitiator>_>.
           _M_t.
           super__Tuple_impl<0UL,_FIX::SocketInitiator_*,_std::default_delete<FIX::SocketInitiator>_>
           .super__Head_base<0UL,_FIX::SocketInitiator_*,_false>._M_head_impl;
  (local_258->_M_t).
  super___uniq_ptr_impl<FIX::SocketInitiator,_std::default_delete<FIX::SocketInitiator>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketInitiator_*,_std::default_delete<FIX::SocketInitiator>_>.
  super__Head_base<0UL,_FIX::SocketInitiator_*,_false>._M_head_impl = this_05;
  if (pSVar4 != (SocketInitiator *)0x0) {
    (**(code **)(*(long *)pSVar4 + 8))();
  }
  pTVar10 = (TestSession *)operator_new(0x888);
  CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX
  ::SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const__int_
            (pTVar10,(Application *)app,(MessageStoreFactory *)factory,pSVar1,
             (DataDictionaryProvider *)this,
             (this->super_BaseSocketConnection).sessionTime._M_t.
             super___uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>._M_t.
             super__Tuple_impl<0UL,_FIX::TimeRange_*,_std::default_delete<FIX::TimeRange>_>.
             super__Head_base<0UL,_FIX::TimeRange_*,_false>._M_head_impl,in_stack_fffffffffffffc78);
  pTVar2 = (local_2b0->_M_t).super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>.
           _M_t.super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
           super__Head_base<0UL,_TestSession_*,_false>._M_head_impl;
  (local_2b0->_M_t).super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
  super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
  super__Head_base<0UL,_TestSession_*,_false>._M_head_impl = pTVar10;
  if (pTVar2 != (TestSession *)0x0) {
    (**(code **)(*(long *)pTVar2 + 8))();
  }
  this_06 = (TestSocketInitiator *)operator_new(0x490);
  pTVar2 = (local_2b0->_M_t).super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>.
           _M_t.super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
           super__Head_base<0UL,_TestSession_*,_false>._M_head_impl;
  FIX::SocketInitiator::SocketInitiator
            ((SocketInitiator *)this_06,(Application *)app,(MessageStoreFactory *)factory,this_01);
  pSVar9 = local_260;
  *(undefined ***)this_06 = &PTR__SocketInitiator_002fe7d0;
  *(undefined ***)&this_06->field_0x228 = &PTR__TestSocketInitiator_002fe858;
  this_06->pSession = &pTVar2->super_Session;
  pTVar5 = (local_268->_M_t).
           super___uniq_ptr_impl<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>.
           _M_t.
           super__Tuple_impl<0UL,_TestSocketInitiator_*,_std::default_delete<TestSocketInitiator>_>.
           super__Head_base<0UL,_TestSocketInitiator_*,_false>._M_head_impl;
  (local_268->_M_t).
  super___uniq_ptr_impl<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>._M_t.
  super__Tuple_impl<0UL,_TestSocketInitiator_*,_std::default_delete<TestSocketInitiator>_>.
  super__Head_base<0UL,_TestSocketInitiator_*,_false>._M_head_impl = this_06;
  if (pTVar5 != (TestSocketInitiator *)0x0) {
    (**(code **)(*(long *)pTVar5 + 8))();
  }
  (this->pSocketConnection)._M_t.
  super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>.
  super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl = (SocketConnection *)0x0;
  this_07 = (SocketConnection *)operator_new(0x2100);
  FIX::SocketConnection::SocketConnection
            (this_07,&((this->super_BaseSocketConnection).testInitiator._M_t.
                       super___uniq_ptr_impl<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_TestSocketInitiator_*,_std::default_delete<TestSocketInitiator>_>
                       .super__Head_base<0UL,_TestSocketInitiator_*,_false>._M_head_impl)->
                      super_SocketInitiator,local_2a0,(this->super_BaseSocketConnection).socket,
             pSVar9);
  pSVar6 = (this->pSocketConnection)._M_t.
           super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>
           ._M_t.
           super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>
           .super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl;
  (this->pSocketConnection)._M_t.
  super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>.
  super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl = this_07;
  if (pSVar6 != (SocketConnection *)0x0) {
    (**(code **)(*(long *)pSVar6 + 8))();
  }
  return;
}

Assistant:

TestSessionConnection()
        : BaseSocketConnection() {
      pSocketConnection.reset(new SocketConnection(*testInitiator, initiatorSessionID, socket, &monitor));
    }